

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O0

void Fxch_ManDivCreate(Fxch_Man_t *pFxchMan)

{
  int iVar1;
  Vec_Que_t *pVVar2;
  float **pCosts;
  float fVar3;
  int local_28;
  int iCube;
  int fUpdate;
  int fAdd;
  float Weight;
  Vec_Int_t *vCube;
  Fxch_Man_t *pFxchMan_local;
  
  for (local_28 = 0; iVar1 = Vec_WecSize(pFxchMan->vCubes), local_28 < iVar1;
      local_28 = local_28 + 1) {
    Vec_WecEntry(pFxchMan->vCubes,local_28);
    Fxch_ManDivSingleCube(pFxchMan,local_28,1,0);
    Fxch_ManDivDoubleCube(pFxchMan,local_28,1,0);
  }
  iVar1 = Vec_FltSize(pFxchMan->vDivWeights);
  pVVar2 = Vec_QueAlloc(iVar1);
  pFxchMan->vDivPrio = pVVar2;
  pVVar2 = pFxchMan->vDivPrio;
  pCosts = Vec_FltArrayP(pFxchMan->vDivWeights);
  Vec_QueSetPriority(pVVar2,pCosts);
  for (local_28 = 0; iVar1 = Vec_FltSize(pFxchMan->vDivWeights), local_28 < iVar1;
      local_28 = local_28 + 1) {
    fVar3 = Vec_FltEntry(pFxchMan->vDivWeights,local_28);
    if (0.0 < fVar3) {
      Vec_QuePush(pFxchMan->vDivPrio,local_28);
    }
  }
  return;
}

Assistant:

void Fxch_ManDivCreate( Fxch_Man_t* pFxchMan )
{
    Vec_Int_t* vCube;
    float Weight;
    int fAdd = 1,
        fUpdate = 0,
        iCube;

    Vec_WecForEachLevel( pFxchMan->vCubes, vCube, iCube )
    {
        Fxch_ManDivSingleCube( pFxchMan, iCube, fAdd, fUpdate );
        Fxch_ManDivDoubleCube( pFxchMan, iCube, fAdd, fUpdate );
    }

    pFxchMan->vDivPrio = Vec_QueAlloc( Vec_FltSize( pFxchMan->vDivWeights ) );
    Vec_QueSetPriority( pFxchMan->vDivPrio, Vec_FltArrayP( pFxchMan->vDivWeights ) );
    Vec_FltForEachEntry( pFxchMan->vDivWeights, Weight, iCube )
    {
        if ( Weight > 0.0 )
            Vec_QuePush( pFxchMan->vDivPrio, iCube );
    }
}